

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalUnixMakefileGenerator3 *lg,string *targetDir,string *lang,
          DependencyMap *validDeps)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmMakefile *this_00;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string complainRegex;
  string scanRegex;
  string scanRegexVar;
  string complainRegexVar;
  long *local_138;
  undefined8 local_130;
  long local_128 [2];
  long *local_118;
  undefined8 local_110;
  long local_108 [2];
  string local_f8;
  string local_c8;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_a8;
  RegularExpression *local_a0;
  RegularExpression *local_98;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  pcVar3 = (targetDir->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + targetDir->_M_string_length);
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_008525c8;
  local_98 = &this->IncludeRegexLine;
  (this->IncludeRegexLine).regmust = (char *)0x0;
  (this->IncludeRegexLine).program = (char *)0x0;
  (this->IncludeRegexLine).progsize = 0;
  memset(local_98,0,0xaa);
  local_a0 = &this->IncludeRegexScan;
  (this->IncludeRegexScan).regmust = (char *)0x0;
  (this->IncludeRegexScan).program = (char *)0x0;
  (this->IncludeRegexScan).progsize = 0;
  memset(local_a0,0,0xaa);
  (this->IncludeRegexComplain).regmust = (char *)0x0;
  (this->IncludeRegexComplain).program = (char *)0x0;
  (this->IncludeRegexComplain).progsize = 0;
  memset(&this->IncludeRegexComplain,0,0xaa);
  (this->IncludeRegexLineString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexLineString).field_2
  ;
  (this->IncludeRegexLineString)._M_string_length = 0;
  (this->IncludeRegexLineString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexScanString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexScanString).field_2
  ;
  (this->IncludeRegexScanString)._M_string_length = 0;
  (this->IncludeRegexScanString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexComplainString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexComplainString).field_2;
  (this->IncludeRegexComplainString)._M_string_length = 0;
  (this->IncludeRegexComplainString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransformString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexTransformString).field_2;
  (this->IncludeRegexTransformString)._M_string_length = 0;
  (this->IncludeRegexTransformString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransform).regmust = (char *)0x0;
  (this->IncludeRegexTransform).program = (char *)0x0;
  (this->IncludeRegexTransform).progsize = 0;
  memset(&this->IncludeRegexTransform,0,0xaa);
  p_Var1 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ValidDeps = validDeps;
  p_Var1 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_a8 = &this->Unscanned;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->Unscanned).c.
  super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
  _M_initialize_map((_Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                     *)local_a8,0);
  p_Var1 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CacheFileName)._M_dataplus._M_p = (pointer)&(this->CacheFileName).field_2;
  (this->CacheFileName)._M_string_length = 0;
  (this->CacheFileName).field_2._M_local_buf[0] = '\0';
  this_00 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,lang);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"^.*$","");
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"^$","");
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(lang->_M_dataplus)._M_p;
  local_60 = lang->_M_string_length;
  local_70._M_len = 6;
  local_70._M_str = "CMAKE_";
  local_50 = 0x13;
  local_48 = "_INCLUDE_REGEX_SCAN";
  views._M_len = 3;
  views._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_f8,views);
  cVar4 = cmMakefile::GetDefinition(this_00,&local_f8);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_118);
  }
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(lang->_M_dataplus)._M_p;
  local_60 = lang->_M_string_length;
  local_70._M_len = 6;
  local_70._M_str = "CMAKE_";
  local_50 = 0x17;
  local_48 = "_INCLUDE_REGEX_COMPLAIN";
  views_00._M_len = 3;
  views_00._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_c8,views_00);
  cVar4 = cmMakefile::GetDefinition(this_00,&local_c8);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  cmsys::RegularExpression::compile
            (local_98,"^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  cmsys::RegularExpression::compile(local_a0,(char *)local_118);
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,(char *)local_138);
  std::__cxx11::string::_M_replace
            ((ulong)&this->IncludeRegexLineString,0,
             (char *)(this->IncludeRegexLineString)._M_string_length,0x6c31e9);
  local_70._M_len = 0x13;
  local_70._M_str = "#IncludeRegexScan: ";
  local_60 = local_110;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_118;
  views_01._M_len = 2;
  views_01._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_f8,views_01);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexScanString,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_len = 0x17;
  local_70._M_str = "#IncludeRegexComplain: ";
  local_60 = local_130;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_138;
  views_02._M_len = 2;
  views_02._M_array = &local_70;
  cmCatViews_abi_cxx11_(&local_f8,views_02);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexComplainString,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  SetupTransforms(this);
  local_70._M_str = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  local_70._M_len = (this->super_cmDepends).TargetDirectory._M_string_length;
  local_f8._M_dataplus._M_p = (pointer)0x1;
  local_f8.field_2._M_local_buf[0] = '/';
  local_60 = 1;
  local_48 = (lang->_M_dataplus)._M_p;
  local_50 = lang->_M_string_length;
  local_40 = 0xd;
  local_38 = ".includecache";
  views_03._M_len = 4;
  views_03._M_array = &local_70;
  local_f8._M_string_length = (size_type)paVar2;
  local_58 = paVar2;
  cmCatViews_abi_cxx11_(&local_c8,views_03);
  std::__cxx11::string::operator=((string *)&this->CacheFileName,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  ReadCacheFile(this);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalUnixMakefileGenerator3* lg,
                       const std::string& targetDir, const std::string& lang,
                       const DependencyMap* validDeps)
  : cmDepends(lg, targetDir)
  , ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
    std::string scanRegexVar = cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_SCAN");
    if (cmValue sr = mf->GetDefinition(scanRegexVar)) {
      scanRegex = *sr;
    }
    std::string complainRegexVar =
      cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_COMPLAIN");
    if (cmValue cr = mf->GetDefinition(complainRegexVar)) {
      complainRegex = *cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex);
  this->IncludeRegexComplain.compile(complainRegex);
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString =
    cmStrCat(INCLUDE_REGEX_SCAN_MARKER, scanRegex);
  this->IncludeRegexComplainString =
    cmStrCat(INCLUDE_REGEX_COMPLAIN_MARKER, complainRegex);

  this->SetupTransforms();

  this->CacheFileName =
    cmStrCat(this->TargetDirectory, '/', lang, ".includecache");

  this->ReadCacheFile();
}